

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<QUrl,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  char16_t **ppcVar1;
  long in_FS_OFFSET;
  QUrl local_20;
  QDebug local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d = (QUrlPrivate *)dbg->stream;
  ppcVar1 = &((local_20.d)->userName).d.ptr;
  *(int *)ppcVar1 = *(int *)ppcVar1 + 1;
  ::operator<<((Stream *)&local_18,&local_20);
  QDebug::~QDebug(&local_18);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }